

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Type> *
wasm::WATParser::singlevaltype<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  bool bVar1;
  Lexer *pLVar2;
  Type *u;
  basic_string_view<char,_std::char_traits<char>_> expected;
  allocator<char> local_161;
  string local_160;
  Err local_140;
  uint local_11c;
  Err local_118;
  Err *local_f8;
  Err *err;
  undefined1 local_e0 [8];
  MaybeResult<wasm::Type> _val;
  MaybeResult<wasm::Type> type;
  Type local_78;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  Type local_60;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  Type local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  Type local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ParseModuleTypesCtx *local_18;
  ParseModuleTypesCtx *ctx_local;
  
  local_18 = ctx;
  ctx_local = (ParseModuleTypesCtx *)__return_storage_ptr__;
  local_28 = sv("i32",3);
  bVar1 = Lexer::takeKeyword(&ctx->in,local_28);
  if (bVar1) {
    local_30.id = (uintptr_t)
                  TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeI32
                            (&local_18->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>);
    Result<wasm::Type>::Result<wasm::Type>(__return_storage_ptr__,&local_30);
  }
  else {
    pLVar2 = &local_18->in;
    local_40 = sv("i64",3);
    bVar1 = Lexer::takeKeyword(pLVar2,local_40);
    if (bVar1) {
      local_48.id = (uintptr_t)
                    TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeI64
                              (&local_18->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>)
      ;
      Result<wasm::Type>::Result<wasm::Type>(__return_storage_ptr__,&local_48);
    }
    else {
      pLVar2 = &local_18->in;
      local_58 = sv("f32",3);
      bVar1 = Lexer::takeKeyword(pLVar2,local_58);
      if (bVar1) {
        local_60.id = (uintptr_t)
                      TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeF32
                                (&local_18->
                                  super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>);
        Result<wasm::Type>::Result<wasm::Type>(__return_storage_ptr__,&local_60);
      }
      else {
        pLVar2 = &local_18->in;
        local_70 = sv("f64",3);
        bVar1 = Lexer::takeKeyword(pLVar2,local_70);
        if (bVar1) {
          local_78.id = (uintptr_t)
                        TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeF64
                                  (&local_18->
                                    super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>);
          Result<wasm::Type>::Result<wasm::Type>(__return_storage_ptr__,&local_78);
        }
        else {
          pLVar2 = &local_18->in;
          expected = sv("v128",4);
          bVar1 = Lexer::takeKeyword(pLVar2,expected);
          if (bVar1) {
            type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._32_8_ =
                 TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::makeV128
                           (&local_18->super_TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>);
            Result<wasm::Type>::Result<wasm::Type>
                      (__return_storage_ptr__,
                       (Type *)((long)&type.val.
                                       super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> +
                               0x20));
          }
          else {
            maybeReftype<wasm::WATParser::ParseModuleTypesCtx>
                      ((MaybeResult<wasm::Type> *)
                       ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20),
                       local_18);
            bVar1 = wasm::MaybeResult::operator_cast_to_bool
                              ((MaybeResult *)
                               ((long)&_val.val.
                                       super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> +
                               0x20));
            if (bVar1) {
              MaybeResult<wasm::Type>::MaybeResult
                        ((MaybeResult<wasm::Type> *)local_e0,
                         (MaybeResult<wasm::Type> *)
                         ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
              local_f8 = MaybeResult<wasm::Type>::getErr((MaybeResult<wasm::Type> *)local_e0);
              bVar1 = local_f8 != (Err *)0x0;
              if (bVar1) {
                wasm::Err::Err(&local_118,local_f8);
                Result<wasm::Type>::Result(__return_storage_ptr__,&local_118);
                wasm::Err::~Err(&local_118);
              }
              local_11c = (uint)bVar1;
              MaybeResult<wasm::Type>::~MaybeResult((MaybeResult<wasm::Type> *)local_e0);
              if (local_11c == 0) {
                u = MaybeResult<wasm::Type>::operator*
                              ((MaybeResult<wasm::Type> *)
                               ((long)&_val.val.
                                       super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> +
                               0x20));
                Result<wasm::Type>::Result<wasm::Type&>(__return_storage_ptr__,u);
                local_11c = 1;
              }
            }
            else {
              pLVar2 = &local_18->in;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_160,"expected valtype",&local_161);
              Lexer::err(&local_140,pLVar2,&local_160);
              Result<wasm::Type>::Result(__return_storage_ptr__,&local_140);
              wasm::Err::~Err(&local_140);
              std::__cxx11::string::~string((string *)&local_160);
              std::allocator<char>::~allocator(&local_161);
              local_11c = 1;
            }
            MaybeResult<wasm::Type>::~MaybeResult
                      ((MaybeResult<wasm::Type> *)
                       ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeT> singlevaltype(Ctx& ctx) {
  if (ctx.in.takeKeyword("i32"sv)) {
    return ctx.makeI32();
  } else if (ctx.in.takeKeyword("i64"sv)) {
    return ctx.makeI64();
  } else if (ctx.in.takeKeyword("f32"sv)) {
    return ctx.makeF32();
  } else if (ctx.in.takeKeyword("f64"sv)) {
    return ctx.makeF64();
  } else if (ctx.in.takeKeyword("v128"sv)) {
    return ctx.makeV128();
  } else if (auto type = maybeReftype(ctx)) {
    CHECK_ERR(type);
    return *type;
  } else {
    return ctx.in.err("expected valtype");
  }
}